

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

String * kj::Path::stripNul(String *__return_storage_ptr__,String *input)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_t capacity;
  char *pcVar4;
  Vector<char> output;
  Vector<char> local_58;
  
  sVar2 = (input->content).size_;
  capacity = sVar2 - 1;
  if (sVar2 == 0) {
    capacity = 0;
  }
  local_58.builder.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (1,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58.builder.endPtr = local_58.builder.ptr + capacity;
  local_58.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar4 = (input->content).ptr;
  sVar2 = (input->content).size_;
  pcVar3 = pcVar4 + (sVar2 - 1);
  local_58.builder.pos = local_58.builder.ptr;
  if (sVar2 == 0) {
    pcVar3 = (char *)0x0;
    pcVar4 = (char *)0x0;
  }
  for (; pcVar4 != pcVar3; pcVar4 = pcVar4 + 1) {
    cVar1 = *pcVar4;
    if (cVar1 != '\0') {
      if (local_58.builder.pos == local_58.builder.endPtr) {
        sVar2 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
        if (local_58.builder.endPtr == local_58.builder.ptr) {
          sVar2 = 4;
        }
        Vector<char>::setCapacity(&local_58,sVar2);
      }
      *local_58.builder.pos = cVar1;
      local_58.builder.pos = local_58.builder.pos + 1;
    }
  }
  if (local_58.builder.pos == local_58.builder.endPtr) {
    sVar2 = 4;
    if (local_58.builder.endPtr != local_58.builder.ptr) {
      sVar2 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_58,sVar2);
  }
  *local_58.builder.pos = '\0';
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (__return_storage_ptr__->content).ptr = local_58.builder.ptr;
  (__return_storage_ptr__->content).size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (__return_storage_ptr__->content).disposer = local_58.builder.disposer;
  return __return_storage_ptr__;
}

Assistant:

String Path::stripNul(String input) {
  kj::Vector<char> output(input.size());
  for (char c: input) {
    if (c != '\0') output.add(c);
  }
  output.add('\0');
  return String(output.releaseAsArray());
}